

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wstring(OutputFile *this,string *s)

{
  std::operator<<((ostream *)
                  &((this->blocks).
                    super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1]->fragments).
                   super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]->stream,(string *)s);
  return this;
}

Assistant:

OutputFile & OutputFile::wstring (const std::string & s)
{
	stream () << s;
	return *this;
}